

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O1

void __thiscall
gtl::internal_btree::
btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
::uninitialized_move_n
          (btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
           *this,size_type n,size_type i,size_type j,
          btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result,_std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>,_std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>,_256,_false>_>
          *x,allocator_type *alloc)

{
  undefined8 uVar1;
  long lVar2;
  
  if ((((ulong)x & 7) == 0) && (((ulong)this & 7) == 0)) {
    if (n != 0) {
      lVar2 = 0;
      do {
        *(undefined8 *)(x + lVar2 + (long)(int)j * 0x18 + 0x20) =
             *(undefined8 *)(this + lVar2 + (long)(int)i * 0x18 + 0x20);
        uVar1 = *(undefined8 *)(this + lVar2 + (long)(int)i * 0x18 + 0x10 + 8);
        *(undefined8 *)(x + lVar2 + (long)(int)j * 0x18 + 0x10) =
             *(undefined8 *)(this + lVar2 + (long)(int)i * 0x18 + 0x10);
        *(undefined8 *)(x + lVar2 + (long)(int)j * 0x18 + 0x10 + 8) = uVar1;
        lVar2 = lVar2 + 0x18;
      } while (n * 0x18 != lVar2);
    }
    return;
  }
  __assert_fail("reinterpret_cast<uintptr_t>(p) % alignment == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/figroc[P]s2geometry/src/s2/third_party/absl/container/internal/layout.h"
                ,0x1e1,
                "CopyConst<Char, ElementType<N>> *absl::container_internal::internal_layout::LayoutImpl<std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>, absl::integer_sequence<unsigned long, 0, 1, 2, 3>>::Pointer(Char *) const [Elements = std::tuple<gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *, unsigned char, gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>::slot_type, gtl::internal_btree::btree_node<gtl::internal_btree::set_params<S2ClosestCellQueryBase<S2MinDistance>::Result, std::less<S2ClosestCellQueryBase<S2MinDistance>::Result>, std::allocator<S2ClosestCellQueryBase<S2MinDistance>::Result>, 256, false>> *>, SizeSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, OffsetSeq = absl::integer_sequence<unsigned long, 0, 1, 2, 3>, N = 2UL, Char = char]"
               );
}

Assistant:

void uninitialized_move_n(const size_type n, const size_type i,
                            const size_type j, btree_node *x,
                            allocator_type *alloc) {
    absl::container_internal::SanitizerUnpoisonMemoryRegion(
        x->slot(j), n * sizeof(slot_type));
    for (slot_type *src = slot(i), *end = src + n, *dest = x->slot(j);
         src != end; ++src, ++dest) {
      slot_type::construct(alloc, dest, src);
    }
  }